

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

bool __thiscall
wabt::Decompiler::CheckImportExport
          (Decompiler *this,string *s,ExternalKind kind,Index index,string_view name)

{
  Module *this_00;
  bool bVar1;
  Export *pEVar2;
  Location local_98;
  Var local_78;
  
  this_00 = (this->mc).module;
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename._M_len = 0;
  local_98.filename._M_str._0_4_ = 0;
  local_98.filename._M_str._4_4_ = 0;
  Var::Var(&local_78,index,&local_98);
  bVar1 = Module::IsImport(this_00,kind,&local_78);
  Var::~Var(&local_78);
  pEVar2 = Module::GetExport((this->mc).module,name);
  if ((pEVar2 != (Export *)0x0) && (pEVar2->kind == kind)) {
    std::__cxx11::string::append((char *)s);
  }
  if (bVar1) {
    std::__cxx11::string::append((char *)s);
  }
  return bVar1;
}

Assistant:

bool CheckImportExport(std::string& s,
                         ExternalKind kind,
                         Index index,
                         std::string_view name) {
    // Figure out if this thing is imported, exported, or neither.
    auto is_import = mc.module.IsImport(kind, Var(index, Location()));
    // TODO: is this the best way to check for export?
    // FIXME: this doesn't work for functions that get renamed in some way,
    // as the export has the original name..
    auto xport = mc.module.GetExport(name);
    auto is_export = xport && xport->kind == kind;
    if (is_export)
      s += "export ";
    if (is_import)
      s += "import ";
    return is_import;
  }